

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolsb.c
# Opt level: O2

int fffi2s1(short *input,long ntodo,double scale,double zero,int nullcheck,short tnull,char nullval,
           char *nullarray,int *anynull,char *output,int *status)

{
  long lVar1;
  char cVar2;
  short sVar3;
  long lVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    lVar4 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        dVar5 = (double)(int)input[lVar4] * scale + zero;
        if (-128.49 <= dVar5) {
          if (dVar5 <= 127.49) {
            cVar2 = (char)(int)dVar5;
          }
          else {
            *status = -0xb;
            cVar2 = '\x7f';
          }
        }
        else {
          *status = -0xb;
          cVar2 = -0x80;
        }
        output[lVar4] = cVar2;
      }
    }
    else {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        sVar3 = input[lVar4];
        if (sVar3 < -0x80) {
          *status = -0xb;
          sVar3 = 0x80;
        }
        else if (0x7f < sVar3) {
          *status = -0xb;
          sVar3 = 0x7f;
        }
        output[lVar4] = (char)sVar3;
      }
    }
  }
  else {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    lVar4 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        if (input[lVar4] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar4] = nullval;
          }
          else {
            nullarray[lVar4] = '\x01';
          }
        }
        else {
          dVar5 = (double)(int)input[lVar4] * scale + zero;
          if (-128.49 <= dVar5) {
            if (dVar5 <= 127.49) {
              output[lVar4] = (char)(int)dVar5;
            }
            else {
              *status = -0xb;
              output[lVar4] = '\x7f';
            }
          }
          else {
            *status = -0xb;
            output[lVar4] = -0x80;
          }
        }
      }
    }
    else {
      for (; lVar1 != lVar4; lVar4 = lVar4 + 1) {
        sVar3 = input[lVar4];
        if (sVar3 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar4] = nullval;
          }
          else {
            nullarray[lVar4] = '\x01';
          }
        }
        else if (sVar3 < -0x80) {
          *status = -0xb;
          output[lVar4] = -0x80;
        }
        else if (sVar3 < 0x80) {
          output[lVar4] = (char)sVar3;
        }
        else {
          *status = -0xb;
          output[lVar4] = '\x7f';
        }
      }
    }
  }
  return *status;
}

Assistant:

int fffi2s1(short *input,         /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            short tnull,          /* I - value of FITS TNULLn keyword if any */
            signed char nullval,  /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            signed char *output,  /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < -128)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (input[ii] > 127)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = -128;
                }
                else if (dvalue > DSCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 127;
                }
                else
                    output[ii] = (signed char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }

                else
                {
                    if (input[ii] < -128)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (input[ii] > 127)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = -128;
                    }
                    else if (dvalue > DSCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 127;
                    }
                    else
                        output[ii] = (signed char) dvalue;
                }
            }
        }
    }
    return(*status);
}